

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olddecorations.cpp
# Opt level: O0

void ParseSpriteFrames(PClassActor *info,TArray<FState,_FState> *states,
                      TArray<FScriptPosition,_FScriptPosition> *SourceLines,FScanner *sc)

{
  long lVar1;
  FScriptPosition local_a0 [2];
  FScriptPosition local_80;
  char *local_70;
  char *stop;
  char *colon;
  bool firstState;
  char *pcStack_58;
  int rate;
  char *token;
  FState state;
  FScanner *sc_local;
  TArray<FScriptPosition,_FScriptPosition> *SourceLines_local;
  TArray<FState,_FState> *states_local;
  PClassActor *info_local;
  
  state._32_8_ = sc;
  pcStack_58 = strtok(sc->String,",\t\n\r");
  memset(&token,0,0x28);
  state.Tics._1_1_ = info->DefaultStateUsage;
  while (pcStack_58 != (char *)0x0) {
    for (; *pcStack_58 == ' '; pcStack_58 = pcStack_58 + 1) {
    }
    colon._4_4_ = 4;
    colon._3_1_ = 1;
    stop = strchr(pcStack_58,0x3a);
    if (stop != (char *)0x0) {
      *stop = '\0';
      lVar1 = strtol(pcStack_58,&local_70,10);
      colon._4_4_ = (int)lVar1;
      if (((local_70 == pcStack_58) || (colon._4_4_ < 1)) || (0xfffe < colon._4_4_)) {
        FScanner::ScriptError((FScanner *)state._32_8_,"Rates must be in the range [0,65534]");
      }
      pcStack_58 = stop + 1;
    }
    state.ActionFunc._4_2_ = (undefined2)colon._4_4_;
    state.ActionFunc._6_2_ = 0;
    for (; *pcStack_58 != '\0'; pcStack_58 = pcStack_58 + 1) {
      if (*pcStack_58 != ' ') {
        if (*pcStack_58 == '*') {
          if ((colon._3_1_ & 1) != 0) {
            FScanner::ScriptError((FScanner *)state._32_8_,"* must come after a frame");
          }
          state.sprite._2_2_ = state.sprite._2_2_ | 4;
        }
        else if ((*pcStack_58 < 'A') || (']' < *pcStack_58)) {
          FScanner::ScriptError((FScanner *)state._32_8_,"Frames must be A-Z, [, \\, or ]");
        }
        else {
          if ((colon._3_1_ & 1) == 0) {
            TArray<FState,_FState>::Push(states,(FState *)&token);
            FScriptPosition::FScriptPosition(&local_80,(FScanner *)state._32_8_);
            TArray<FScriptPosition,_FScriptPosition>::Push(SourceLines,&local_80);
            FScriptPosition::~FScriptPosition(&local_80);
          }
          colon._3_1_ = 0;
          state.Tics._0_1_ = *pcStack_58 + -0x41;
        }
      }
    }
    if ((colon._3_1_ & 1) == 0) {
      TArray<FState,_FState>::Push(states,(FState *)&token);
      FScriptPosition::FScriptPosition(local_a0,(FScanner *)state._32_8_);
      TArray<FScriptPosition,_FScriptPosition>::Push(SourceLines,local_a0);
      FScriptPosition::~FScriptPosition(local_a0);
    }
    pcStack_58 = strtok((char *)0x0,",\t\n\r");
  }
  return;
}

Assistant:

static void ParseSpriteFrames (PClassActor *info, TArray<FState> &states, TArray<FScriptPosition> &SourceLines, FScanner &sc)
{
	FState state;
	char *token = strtok (sc.String, ",\t\n\r");

	memset (&state, 0, sizeof(state));
	state.UseFlags = info->DefaultStateUsage;

	while (token != NULL)
	{
		// Skip leading white space
		while (*token == ' ')
			token++;

		int rate = 4;
		bool firstState = true;
		char *colon = strchr (token, ':');

		if (colon != NULL)
		{
			char *stop;

			*colon = 0;
			rate = strtol (token, &stop, 10);
			if (stop == token || rate < 1 || rate > 65534)
			{
				sc.ScriptError ("Rates must be in the range [0,65534]");
			}
			token = colon + 1;
		}

		state.Tics = rate;
		state.TicRange = 0;

		while (*token)
		{
			if (*token == ' ')
			{
			}
			else if (*token == '*')
			{
				if (firstState)
				{
					sc.ScriptError ("* must come after a frame");
				}
				state.StateFlags |= STF_FULLBRIGHT;
			}
			else if (*token < 'A' || *token > ']')
			{
				sc.ScriptError ("Frames must be A-Z, [, \\, or ]");
			}
			else
			{
				if (!firstState)
				{
					states.Push (state);
					SourceLines.Push(sc);
				}
				firstState = false;
				state.Frame = *token-'A';	
			}
			++token;
		}
		if (!firstState)
		{
			states.Push (state);
			SourceLines.Push(sc);
		}

		token = strtok (NULL, ",\t\n\r");
	}
}